

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom_parser.c
# Opt level: O1

igsc_oprom_type image_oprom_get_type(igsc_oprom_image *img)

{
  igsc_oprom_type iVar1;
  igsc_oprom_type iVar2;
  
  if (img->data_part_ptr == (uint8_t *)0x0) {
    iVar1 = IGSC_OPROM_NONE;
  }
  else {
    iVar1 = (igsc_oprom_type)(img->data_part_len != 0);
  }
  iVar2 = iVar1;
  if ((img->code_part_ptr != (uint8_t *)0x0) &&
     (iVar2 = iVar1 + IGSC_OPROM_CODE, img->code_part_len == 0)) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

enum igsc_oprom_type image_oprom_get_type(struct igsc_oprom_image *img)
{
    enum igsc_oprom_type type = IGSC_OPROM_NONE;

    if (img->data_part_ptr && img->data_part_len)
    {
       type |= IGSC_OPROM_DATA;
    }

    if (img->code_part_ptr && img->code_part_len)
    {
       type |= IGSC_OPROM_CODE;
    }

    return type;
}